

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O1

void __thiscall
wasm::SExpressionWasmBuilder::parseElem(SExpressionWasmBuilder *this,Element *s,Table *table)

{
  pointer *ppNVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  iterator iVar5;
  pointer puVar6;
  _Head_base<0UL,_wasm::Table_*,_false> _Var7;
  bool bVar8;
  bool bVar9;
  Const *pCVar10;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var11;
  Element *pEVar12;
  Element *pEVar13;
  __uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
  _Var14;
  List *pLVar15;
  Expression *pEVar16;
  Type TVar17;
  string *psVar18;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  default_delete<wasm::ElementSegment> *this_00;
  undefined1 uVar19;
  Index i;
  IString IVar20;
  IString str;
  IString str_00;
  anon_union_16_5_9943fe1e_for_Literal_0 local_c0;
  undefined8 local_b0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  string_view local_50;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_40;
  __single_object segment_1;
  __single_object segment;
  
  iVar2 = this->elemCounter;
  this->elemCounter = iVar2 + 1;
  local_50 = (string_view)Name::fromInt((long)iVar2);
  if (table != (Table *)0x0) {
    local_68 = s;
    pCVar10 = (Const *)MixedArena::allocSpace(this->allocator,0x28,8);
    (pCVar10->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = ConstId;
    (pCVar10->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
    (pCVar10->value).field_0.i64 = 0;
    (pCVar10->value).field_0.func.super_IString.str._M_str = (char *)0x0;
    (pCVar10->value).type.id = 0;
    local_c0.i32 = 0;
    local_b0 = 2;
    pCVar10 = Const::set(pCVar10,(Literal *)&local_c0.func);
    Literal::~Literal((Literal *)&local_c0.func);
    _Var11._M_head_impl = (ElementSegment *)operator_new(0x50);
    sVar3 = (table->super_Importable).super_Named.name.super_IString.str._M_len;
    pcVar4 = (table->super_Importable).super_Named.name.super_IString.str._M_str;
    wasm::Type::Type((Type *)&segment_1,(HeapType)0x1,Nullable);
    ((_Var11._M_head_impl)->super_Named).name.super_IString.str._M_len = 0;
    ((_Var11._M_head_impl)->super_Named).name.super_IString.str._M_str = (char *)0x0;
    ((_Var11._M_head_impl)->super_Named).hasExplicitName = false;
    ((_Var11._M_head_impl)->table).super_IString.str._M_len = sVar3;
    ((_Var11._M_head_impl)->table).super_IString.str._M_str = pcVar4;
    (_Var11._M_head_impl)->offset = (Expression *)pCVar10;
    ((_Var11._M_head_impl)->type).id =
         (uintptr_t)
         segment_1._M_t.
         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
         super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    ((_Var11._M_head_impl)->data).
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((_Var11._M_head_impl)->data).
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var11._M_head_impl)->data).
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((_Var11._M_head_impl)->super_Named).name.super_IString.str._M_len = local_50._M_len;
    ((_Var11._M_head_impl)->super_Named).name.super_IString.str._M_str = local_50._M_str;
    ((_Var11._M_head_impl)->super_Named).hasExplicitName = false;
    iVar5._M_current =
         (this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_40._M_head_impl = _Var11._M_head_impl;
    if (iVar5._M_current ==
        (this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->elemSegmentNames,iVar5,
                 (Name *)&local_50);
    }
    else {
      ((iVar5._M_current)->super_IString).str._M_len = local_50._M_len;
      ((iVar5._M_current)->super_IString).str._M_str = local_50._M_str;
      ppNVar1 = &(this->elemSegmentNames).
                 super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    pEVar12 = local_68;
    pEVar13 = Element::operator[](local_68,1);
    parseElemFinish(this,pEVar12,
                    (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    &local_40,1,pEVar13->isList_);
    if ((_Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>)
        local_40._M_head_impl == (ElementSegment *)0x0) {
      return;
    }
    this_00 = (default_delete<wasm::ElementSegment> *)&local_40;
    _Var11._M_head_impl = local_40._M_head_impl;
    goto LAB_0099d03f;
  }
  i = 1;
  pEVar12 = Element::operator[](s,1);
  if (pEVar12->isList_ == false) {
    pEVar12 = Element::operator[](s,1);
    uVar19 = 0;
    if ((pEVar12->isList_ == false) && (uVar19 = 0, (pEVar12->dollared_ & 1U) != 0)) {
      pEVar12 = Element::operator[](s,1);
      local_50 = (string_view)Element::str(pEVar12);
      i = 2;
      uVar19 = 1;
    }
  }
  else {
    uVar19 = 0;
  }
  iVar5._M_current =
       (this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->elemSegmentNames,iVar5,
               (Name *)&local_50);
  }
  else {
    ((iVar5._M_current)->super_IString).str._M_len = local_50._M_len;
    ((iVar5._M_current)->super_IString).str._M_str = local_50._M_str;
    ppNVar1 = &(this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  pEVar12 = Element::operator[](s,i);
  if (pEVar12->isList_ == false) {
    pEVar12 = Element::operator[](s,i);
    IVar20 = Element::str(pEVar12);
    if (IVar20.str._M_str == _ZN4wasmL7DECLAREE_1) {
      return;
    }
  }
  _Var14.super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
       (__uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>)
       operator_new(0x50);
  *(size_t *)
   _Var14.super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
   _M_t.super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
   super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 8) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x18) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x20) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x30) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x38) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x48) = 0;
  wasm::Type::Type((Type *)((long)_Var14.
                                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl
                           + 0x30),(HeapType)0x1,Nullable);
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x38) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40) = 0;
  *(size_t *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x48) = 0;
  *(size_t *)
   _Var14.super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
   _M_t.super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
   super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = local_50._M_len;
  *(char **)((long)_Var14.
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 8) =
       local_50._M_str;
  *(undefined1 *)
   ((long)_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x10) = uVar19;
  segment_1._M_t.
  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
       )(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
         )_Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
  pEVar12 = Element::operator[](s,i);
  bVar9 = true;
  if (pEVar12->isList_ == true) {
    pEVar12 = Element::operator[](s,i);
    IVar20.str._M_str = extraout_RDX;
    IVar20.str._M_len = DAT_00dbd210;
    bVar8 = elementStartsWith(pEVar12,IVar20);
    if (!bVar8) {
      pEVar12 = Element::operator[](s,i);
      str.str._M_str = extraout_RDX_00;
      str.str._M_len = DAT_00dbd1a0;
      bVar9 = elementStartsWith(pEVar12,str);
      if (bVar9) {
        pEVar12 = Element::operator[](s,i);
        pEVar12 = Element::operator[](pEVar12,1);
        IVar20.str = (string_view)getTableName(this,pEVar12);
        i = i + 1;
        ((IString *)
        ((long)segment_1._M_t.
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x18))->str =
             IVar20.str;
      }
      pEVar12 = Element::operator[](s,i);
      str_00.str._M_str = extraout_RDX_01;
      str_00.str._M_len = _ZN4wasmL6OFFSETE_1;
      bVar9 = elementStartsWith(pEVar12,str_00);
      if (bVar9) {
        pLVar15 = Element::list(pEVar12);
        if (2 < (pLVar15->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
                usedElements) {
          psVar18 = (string *)__cxa_allocate_exception(0x30);
          local_a8 = local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Invalid offset for an element segment.","");
          local_68._0_4_ = (undefined4)s->line;
          local_68._4_4_ = *(undefined4 *)((long)&s->line + 4);
          uStack_60 = (undefined4)s->col;
          uStack_5c = *(undefined4 *)((long)&s->col + 4);
          *(string **)psVar18 = psVar18 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar18,local_a8,local_a8 + local_a0);
          *(undefined4 *)(psVar18 + 0x20) = (undefined4)local_68;
          *(undefined4 *)(psVar18 + 0x24) = local_68._4_4_;
          *(undefined4 *)(psVar18 + 0x28) = uStack_60;
          *(undefined4 *)(psVar18 + 0x2c) = uStack_5c;
          __cxa_throw(psVar18,&ParseException::typeinfo,ParseException::~ParseException);
        }
        pEVar12 = Element::operator[](pEVar12,1);
        pEVar16 = parseExpression(this,pEVar12);
      }
      else {
        pEVar16 = parseExpression(this,pEVar12);
      }
      i = i + 1;
      *(Expression **)
       ((long)segment_1._M_t.
              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28) = pEVar16;
      bVar9 = false;
    }
  }
  pLVar15 = Element::list(s);
  if (((ulong)i <
       (pLVar15->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements)
     && (((pEVar12 = Element::operator[](s,i), pEVar12->isList_ != false ||
          (pEVar12 = Element::operator[](s,i), pEVar12->isList_ != false)) ||
         ((pEVar12->dollared_ & 1U) == 0)))) {
    pEVar12 = Element::operator[](s,i);
    if (pEVar12->isList_ == false) {
      pEVar12 = Element::operator[](s,i);
      IVar20 = Element::str(pEVar12);
      if (IVar20.str._M_str == DAT_00dbd120) {
        i = i + 1;
        goto LAB_0099cfd8;
      }
    }
    pEVar12 = Element::operator[](s,i);
    TVar17 = elementToType(this,pEVar12);
    *(uintptr_t *)
     ((long)segment_1._M_t.
            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
            _M_t.
            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x30) = TVar17.id;
    i = i + 1;
    bVar8 = true;
  }
  else {
LAB_0099cfd8:
    bVar8 = false;
  }
  if ((!bVar9) &&
     (*(long *)((long)segment_1._M_t.
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x20) ==
      0)) {
    puVar6 = (this->wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar6 == (this->wasm->tables).
                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      psVar18 = (string *)__cxa_allocate_exception(0x30);
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"active element without table","");
      local_68._0_4_ = (undefined4)s->line;
      local_68._4_4_ = *(undefined4 *)((long)&s->line + 4);
      uStack_60 = (undefined4)s->col;
      uStack_5c = *(undefined4 *)((long)&s->col + 4);
      *(string **)psVar18 = psVar18 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar18,local_88,local_88 + local_80);
      *(undefined4 *)(psVar18 + 0x20) = (undefined4)local_68;
      *(undefined4 *)(psVar18 + 0x24) = local_68._4_4_;
      *(undefined4 *)(psVar18 + 0x28) = uStack_60;
      *(undefined4 *)(psVar18 + 0x2c) = uStack_5c;
      __cxa_throw(psVar18,&ParseException::typeinfo,ParseException::~ParseException);
    }
    _Var7._M_head_impl =
         (puVar6->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    pcVar4 = *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 8);
    *(undefined8 *)
     ((long)segment_1._M_t.
            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
            _M_t.
            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x18) =
         *(undefined8 *)&(_Var7._M_head_impl)->super_Importable;
    *(char **)((long)segment_1._M_t.
                     super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x20) =
         pcVar4;
  }
  bVar9 = true;
  if (!bVar8) {
    bVar9 = TableUtils::usesExpressions
                      ((ElementSegment *)
                       segment_1._M_t.
                       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                       .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl,this->wasm
                      );
  }
  parseElemFinish(this,s,&segment_1,i,bVar9);
  if ((__uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>)
      segment_1._M_t.
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>)0x0) {
    return;
  }
  this_00 = (default_delete<wasm::ElementSegment> *)&segment_1;
  _Var11._M_head_impl = (ElementSegment *)segment_1;
LAB_0099d03f:
  std::default_delete<wasm::ElementSegment>::operator()(this_00,_Var11._M_head_impl);
  return;
}

Assistant:

void SExpressionWasmBuilder::parseElem(Element& s, Table* table) {
  Index i = 1;
  Name name = Name::fromInt(elemCounter++);
  bool hasExplicitName = false;
  bool isPassive = true;
  bool usesExpressions = false;

  if (table) {
    Expression* offset = allocator.alloc<Const>()->set(Literal(int32_t(0)));
    auto segment = std::make_unique<ElementSegment>(table->name, offset);
    segment->setName(name, hasExplicitName);
    elemSegmentNames.push_back(name);
    parseElemFinish(s, segment, i, s[i]->isList());
    return;
  }

  if (s[i]->isStr() && s[i]->dollared()) {
    name = s[i++]->str();
    hasExplicitName = true;
  }
  elemSegmentNames.push_back(name);
  if (s[i]->isStr() && s[i]->str() == DECLARE) {
    // We don't store declared segments in the IR
    return;
  }

  auto segment = std::make_unique<ElementSegment>();
  segment->setName(name, hasExplicitName);

  if (s[i]->isList() && !elementStartsWith(s[i], REF)) {
    // Optional (table <tableidx>)
    if (elementStartsWith(s[i], TABLE)) {
      auto& inner = *s[i++];
      segment->table = getTableName(*inner[1]);
    }

    // Offset expression (offset (<expr>)) | (<expr>)
    auto& inner = *s[i++];
    if (elementStartsWith(inner, OFFSET)) {
      if (inner.size() > 2) {
        throw ParseException(
          "Invalid offset for an element segment.", s.line, s.col);
      }
      segment->offset = parseExpression(inner[1]);
    } else {
      segment->offset = parseExpression(inner);
    }
    isPassive = false;
  }

  if (i < s.size()) {
    if (s[i]->isStr() && s[i]->dollared()) {
      usesExpressions = false;
    } else if (s[i]->isStr() && s[i]->str() == FUNC) {
      usesExpressions = false;
      i += 1;
    } else {
      segment->type = elementToType(*s[i]);
      usesExpressions = true;
      i += 1;
    }
  }

  if (!isPassive && segment->table.isNull()) {
    if (wasm.tables.empty()) {
      throw ParseException("active element without table", s.line, s.col);
    }
    table = wasm.tables.front().get();
    segment->table = table->name;
  }

  // We may be post-MVP also due to type reasons or otherwise, as detected by
  // the utility function for Binaryen IR.
  usesExpressions =
    usesExpressions || TableUtils::usesExpressions(segment.get(), &wasm);

  parseElemFinish(s, segment, i, usesExpressions);
}